

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

int PrecondB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector fcB,int jok,int *jcurPtr,
            sunrealtype gamma,void *user_data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  sunrealtype *cdotdata;
  sunrealtype *cdata_00;
  long lVar11;
  long lVar12;
  undefined8 in_RDX;
  undefined8 in_RDI;
  undefined4 *in_R8;
  WebData in_R9;
  double in_XMM1_Qa;
  N_Vector rewt;
  WebData wdata;
  void *cvode_mem;
  sunrealtype *rewtdata;
  sunrealtype *cdata;
  sunrealtype *fsave;
  sunrealtype *f1;
  sunrealtype srur;
  sunrealtype save;
  sunrealtype r0;
  sunrealtype r;
  sunrealtype fac;
  sunrealtype uround;
  int retval;
  int mp;
  int mxmp;
  int ngy;
  int ngx;
  int ngrp;
  int *jyr;
  int *jxr;
  int jy;
  int jx;
  int jj;
  int j;
  int igy;
  int igx;
  int ig;
  int if00;
  int if0;
  int i;
  sunindextype denseretval;
  sunindextype **pivot;
  sunrealtype ***P;
  int in_stack_fffffffffffffedc;
  char *in_stack_fffffffffffffee0;
  double dVar13;
  void *in_stack_fffffffffffffee8;
  N_Vector returnvalue;
  WebData wdata_00;
  sunrealtype *t_00;
  double local_d0;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_64;
  int local_4;
  
  cdotdata = (sunrealtype *)CVodeGetAdjCVodeBmem(in_R9->cvode_mem,in_R9->indexB);
  iVar8 = check_retval(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
                      );
  if (iVar8 == 0) {
    returnvalue = in_R9->rewtB;
    CVodeGetErrWeights(cdotdata,returnvalue);
    iVar8 = check_retval(returnvalue,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    if (iVar8 == 0) {
      cdata_00 = (sunrealtype *)N_VGetArrayPointer(in_RDI);
      lVar11 = N_VGetArrayPointer(returnvalue);
      iVar8 = in_R9->mp;
      dVar1 = in_R9->srur;
      iVar3 = in_R9->ngrp;
      iVar4 = in_R9->ngx;
      iVar5 = in_R9->ngy;
      iVar6 = in_R9->mxmp;
      t_00 = in_R9->fsave;
      wdata_00 = in_R9;
      lVar12 = N_VGetArrayPointer(in_R9->vtempB);
      local_d0 = (double)N_VWrmsNorm(in_RDX,returnvalue);
      local_d0 = ABS(in_XMM1_Qa) * 1000.0 * 2.220446049250313e-16 * 2400.0 * local_d0;
      if ((local_d0 == 0.0) && (!NAN(local_d0))) {
        local_d0 = 1.0;
      }
      for (local_78 = 0; local_78 < iVar5; local_78 = local_78 + 1) {
        iVar7 = in_R9->jyr[local_78];
        for (local_74 = 0; local_74 < iVar4; local_74 = local_74 + 1) {
          iVar9 = iVar7 * iVar6 + in_R9->jxr[local_74] * iVar8;
          for (local_7c = 0; local_7c < iVar8; local_7c = local_7c + 1) {
            iVar10 = iVar9 + local_7c;
            dVar2 = cdata_00[iVar10];
            if (dVar1 * ABS(dVar2) <= local_d0 / *(double *)(lVar11 + (long)iVar10 * 8)) {
              dVar13 = local_d0 / *(double *)(lVar11 + (long)iVar10 * 8);
            }
            else {
              dVar13 = dVar1 * ABS(dVar2);
            }
            cdata_00[iVar10] = dVar13 + cdata_00[iVar10];
            fblock((sunrealtype)t_00,cdata_00,(int)((ulong)lVar11 >> 0x20),(int)lVar11,cdotdata,
                   wdata_00);
            for (local_64 = 0; local_64 < iVar8; local_64 = local_64 + 1) {
              in_R9->P[local_74 + local_78 * iVar4][local_64][local_7c] =
                   (*(double *)(lVar12 + (long)local_64 * 8) - t_00[iVar9 + local_64]) *
                   (in_XMM1_Qa / dVar13);
            }
            cdata_00[iVar10] = dVar2;
          }
        }
      }
      for (local_70 = 0; local_70 < iVar3; local_70 = local_70 + 1) {
        SUNDlsMat_denseAddIdentity(in_R9->P[local_70],(long)iVar8);
        lVar11 = SUNDlsMat_denseGETRF
                           (in_R9->P[local_70],(long)iVar8,(long)iVar8,in_R9->pivot[local_70]);
        if (lVar11 != 0) {
          return 1;
        }
      }
      *in_R8 = 1;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int PrecondB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector fcB,
                    sunbooleantype jok, sunbooleantype* jcurPtr,
                    sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  sunindextype denseretval;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, retval;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  void* cvode_mem;
  WebData wdata;
  N_Vector rewt;

  wdata     = (WebData)user_data;
  cvode_mem = CVodeGetAdjCVodeBmem(wdata->cvode_mem, wdata->indexB);
  if (check_retval((void*)cvode_mem, "CVadjGetCVodeBmem", 0)) { return (1); }
  rewt   = wdata->rewtB;
  retval = CVodeGetErrWeights(cvode_mem, rewt);
  if (check_retval(&retval, "CVodeGetErrWeights", 1)) { return (1); }

  cdata    = N_VGetArrayPointer(c);
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1  = N_VGetArrayPointer(wdata->vtempB);
  fac = N_VWrmsNorm(fcB, rewt);
  r0  = SUN_RCONST(1000.0) * SUNRabs(gamma) * uround * NEQ * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * SUNRabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][i][j] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    denseretval = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (denseretval != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}